

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O1

bool __thiscall ImplicitDepLoader::LoadDepsFromLog(ImplicitDepLoader *this,Edge *edge,string *err)

{
  Node *pNVar1;
  Deps *pDVar2;
  iterator iVar3;
  long lVar4;
  DepsLog *this_00;
  
  pNVar1 = *(edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  this_00 = this->deps_log_;
  if (this_00 == (DepsLog *)0x0) {
    pDVar2 = (Deps *)0x0;
  }
  else {
    pDVar2 = DepsLog::GetDeps(this_00,pNVar1);
  }
  if (pDVar2 == (Deps *)0x0) {
    if (g_explaining == true) {
      LoadDepsFromLog((ImplicitDepLoader *)pNVar1);
    }
  }
  else {
    if (pNVar1->mtime_ <= pDVar2->mtime) {
      iVar3 = PreallocateSpace((ImplicitDepLoader *)this_00,edge,pDVar2->node_count);
      if (pDVar2->node_count < 1) {
        return true;
      }
      lVar4 = 0;
      do {
        pNVar1 = pDVar2->nodes[lVar4];
        iVar3._M_current[lVar4] = pNVar1;
        Node::AddOutEdge(pNVar1,edge);
        CreatePhonyInEdge(this,pNVar1);
        lVar4 = lVar4 + 1;
      } while (lVar4 < pDVar2->node_count);
      return true;
    }
    if (g_explaining == true) {
      fprintf(_stderr,"ninja explain: stored deps info out of date for \'%s\' (%ld vs %ld)\n",
              (pNVar1->path_)._M_dataplus._M_p);
      return false;
    }
  }
  return false;
}

Assistant:

bool ImplicitDepLoader::LoadDepsFromLog(Edge* edge, string* err) {
  // NOTE: deps are only supported for single-target edges.
  Node* output = edge->outputs_[0];
  DepsLog::Deps* deps = deps_log_ ? deps_log_->GetDeps(output) : NULL;
  if (!deps) {
    EXPLAIN("deps for '%s' are missing", output->path().c_str());
    return false;
  }

  // Deps are invalid if the output is newer than the deps.
  if (output->mtime() > deps->mtime) {
    EXPLAIN("stored deps info out of date for '%s' (%" PRId64 " vs %" PRId64 ")",
            output->path().c_str(), deps->mtime, output->mtime());
    return false;
  }

  vector<Node*>::iterator implicit_dep =
      PreallocateSpace(edge, deps->node_count);
  for (int i = 0; i < deps->node_count; ++i, ++implicit_dep) {
    Node* node = deps->nodes[i];
    *implicit_dep = node;
    node->AddOutEdge(edge);
    CreatePhonyInEdge(node);
  }
  return true;
}